

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginMenuBar(void)

{
  ImVec2 IVar1;
  ImGuiWindow *this;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  ImVec2 IVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ImRect IVar15;
  ImVec2 local_18;
  ImVec2 local_10;
  
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if ((this->SkipItems == false) && ((this->Flags & 0x400) != 0)) {
    BeginGroup();
    PushID("##menubar");
    IVar15 = ImGuiWindow::MenuBarRect(this);
    fVar11 = this->WindowBorderSize;
    uVar3 = -(uint)(fVar11 <= this->WindowRounding);
    fVar14 = IVar15.Max.x - (float)(~uVar3 & (uint)fVar11 | (uint)this->WindowRounding & uVar3);
    fVar6 = IVar15.Min.x;
    uVar3 = -(uint)(fVar14 <= fVar6);
    fVar10 = (float)(int)(fVar11 + fVar6 + 0.5);
    fVar11 = (float)(int)(fVar11 + IVar15.Min.y + 0.5);
    IVar1 = (this->OuterRectClipped).Min;
    fVar12 = IVar1.x;
    fVar13 = IVar1.y;
    uVar4 = -(uint)(fVar12 <= fVar10);
    uVar5 = -(uint)(fVar13 <= fVar11);
    local_18 = (ImVec2)(CONCAT44(~uVar5 & (uint)fVar13,~uVar4 & (uint)fVar12) |
                       CONCAT44((uint)fVar11 & uVar5,(uint)fVar10 & uVar4));
    auVar8._0_4_ = (float)(int)((float)(uVar3 & (uint)fVar6 | ~uVar3 & (uint)fVar14) + 0.5);
    auVar8._4_4_ = (float)(int)(IVar15.Max.y + 0.5);
    auVar8._8_4_ = (float)(int)(in_XMM1_Dc + 0.0);
    auVar8._12_4_ = (float)(int)(in_XMM1_Dd + 0.0);
    auVar9._8_8_ = 0;
    auVar9._0_4_ = (this->OuterRectClipped).Max.x;
    auVar9._4_4_ = (this->OuterRectClipped).Max.y;
    auVar9 = minps(auVar8,auVar9);
    local_10 = auVar9._0_8_;
    PushClipRect(&local_18,&local_10,false);
    IVar1 = (this->DC).MenuBarOffset;
    IVar7.x = IVar1.x + fVar6;
    IVar7.y = IVar1.y + IVar15.Min.y;
    (this->DC).CursorMaxPos = IVar7;
    (this->DC).CursorPos = IVar7;
    (this->DC).LayoutType = 0;
    (this->DC).NavLayerCurrent = ImGuiNavLayer_Menu;
    (this->DC).MenuBarAppending = true;
    AlignTextToFramePadding();
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}